

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O1

shared_ptr<duckdb::ParquetKeys,_true> __thiscall
duckdb::ObjectCache::Get<duckdb::ParquetKeys>(ObjectCache *this,string *key)

{
  undefined8 uVar1;
  int iVar2;
  ObjectCacheEntry *pOVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  bool bVar5;
  shared_ptr<duckdb::ObjectCacheEntry,_true> sVar6;
  shared_ptr<duckdb::ParquetKeys,_true> sVar7;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  undefined1 local_78 [16];
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_68;
  undefined1 *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 local_48 [32];
  undefined8 local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  sVar6 = GetObject((ObjectCache *)local_78,key);
  uVar1 = local_78._0_8_;
  bVar5 = true;
  _Var4._M_pi = sVar6.internal.
                super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
  if ((element_type *)local_78._0_8_ != (element_type *)0x0) {
    pOVar3 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->
                       ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)local_78);
    (*pOVar3->_vptr_ObjectCacheEntry[2])(&local_58,pOVar3);
    local_48._16_8_ = local_28;
    local_28[0] = (__pthread_internal_list *)0x5f74657571726170;
    local_28[1]._0_4_ = 0x7379656b;
    local_48._24_8_ = 0xc;
    local_28[1]._4_1_ = '\0';
    _Var4._M_pi = local_50;
    if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc) {
      iVar2 = bcmp(local_58,(void *)local_48._16_8_,0xc);
      bVar5 = iVar2 != 0;
      _Var4._M_pi = extraout_RDX;
    }
  }
  if ((element_type *)uVar1 != (element_type *)0x0) {
    if ((undefined8 *)local_48._16_8_ != local_28) {
      operator_delete((void *)local_48._16_8_);
      _Var4._M_pi = extraout_RDX_00;
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  if (bVar5) {
    *(undefined8 *)this = 0;
    *(undefined8 *)&this->field_0x8 = 0;
  }
  else {
    local_68.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_78._0_8_;
    local_68.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
      }
    }
    sVar7 = shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetKeys>((duckdb *)this,&local_68);
    _Var4._M_pi = sVar7.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    if (local_68.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.internal.
                 super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var4._M_pi = extraout_RDX_02;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    _Var4._M_pi = extraout_RDX_03;
  }
  sVar7.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ParquetKeys,_true>)
         sVar7.internal.super___shared_ptr<duckdb::ParquetKeys,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> Get(const string &key) {
		shared_ptr<ObjectCacheEntry> object = GetObject(key);
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}